

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_then.cpp
# Opt level: O3

void __thiscall tst_qpromise_then::nullHandler(tst_qpromise_then *this)

{
  QSharedData *pQVar1;
  anon_class_24_3_5928a092 callback;
  anon_class_24_3_5928a092 callback_00;
  int *piVar2;
  _func_int **pp_Var3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar4;
  bool bVar5;
  char cVar6;
  PromiseDataBase<void,_void_()> *this_00;
  char *pcVar7;
  char *pcVar8;
  PromiseData<int> *this_01;
  QSharedData *pQVar9;
  QPromiseReject<void> *in_R8;
  char *pcVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  Promise p;
  Promise p_1;
  PromiseResolver<int> resolver_1;
  PromiseResolver<void> resolver;
  QPromiseBase<int> local_128;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *local_118;
  QPromiseBase<int> local_110;
  PromiseResolver<int> local_100;
  _Any_data local_f8;
  _Any_data *local_e8;
  _Any_data local_d8;
  PromiseResolver<int> *local_c8;
  code *pcStack_c0;
  QArrayData *local_b0;
  QPromise<int> local_a8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_98;
  storage_type_conflict *psStack_90;
  qsizetype local_88;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_50;
  code *local_40;
  
  local_98.d._0_4_ = 0x2a;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:263:24),_0>
            ((QPromiseBase<int> *)&local_d8,(anon_class_8_1_a8c68091_conflict)&local_98);
  local_d8._M_unused._M_object = &PTR__QPromiseBase_00133820;
  local_f8._8_8_ = &local_50;
  local_50._M_unused._M_object = (void *)0x0;
  local_e8 = &local_78;
  local_78._M_unused._M_object = (void *)0x0;
  callback.fulfilled._0_4_ = (int)local_f8._8_8_;
  callback.this = (QPromiseBase<int> *)&local_d8;
  callback.fulfilled._4_4_ = (int)((ulong)local_f8._8_8_ >> 0x20);
  callback.rejected = (void **)local_e8;
  local_f8._M_unused._M_object = &local_d8;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:58:22),_0>
            (&local_128,callback);
  local_128._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00133820;
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    ((PromiseDataBase<int,_void_(const_int_&)> *)local_d8._8_8_);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              ((PromiseDataBase<int,_void_(const_int_&)> *)local_d8._8_8_);
  }
  local_d8._M_unused._M_object = &PTR__QPromiseBase_001336e8;
  if ((PromiseDataBase<int,_void_(const_int_&)> *)local_d8._8_8_ !=
      (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_d8._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<int,_void_(const_int_&)> *)local_d8._8_8_ !=
        (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
      (**(code **)(*(long *)local_d8._8_8_ + 8))();
    }
  }
  local_100.m_d.d._0_4_ = -1;
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_001337c8;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00133750;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = &this_00->super_QSharedData;
  local_d8._M_unused._M_object = &PTR__QPromiseBase_00133718;
  local_d8._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&local_98,(QPromise<void> *)&local_d8);
  local_d8._M_unused._M_object = &PTR__QPromiseBase_00133688;
  if ((PromiseDataBase<void,_void_()> *)local_d8._8_8_ != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar9 = (QSharedData *)(local_d8._8_8_ + 8);
    (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_d8._8_8_ != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (**(code **)(*(long *)local_d8._8_8_ + 8))();
    }
  }
  QVar4.d = local_128.m_d.d;
  if ((QArrayData *)local_98.d == (QArrayData *)0x0) {
    local_a8.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
    local_f8._8_8_ = (QArrayData *)0x0;
  }
  else {
    LOCK();
    (((QBasicAtomicInt *)&(local_98.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_98.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_a8.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_98.d;
    if ((QArrayData *)local_98.d == (QArrayData *)0x0) {
      local_110._vptr_QPromiseBase = (_func_int **)0x0;
LAB_00109fc5:
      LOCK();
      (((QBasicAtomicInt *)&(local_98.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
      _M_i = (((QBasicAtomicInt *)&(local_98.d)->super_QSharedData)->_q_value).
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_f8._8_8_ = local_110._vptr_QPromiseBase;
      if ((QArrayData *)local_110._vptr_QPromiseBase == (QArrayData *)0x0) goto LAB_00109fda;
    }
    else {
      LOCK();
      (((QBasicAtomicInt *)&(local_98.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
      _M_i = (((QBasicAtomicInt *)&(local_98.d)->super_QSharedData)->_q_value).
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_110._vptr_QPromiseBase = (_func_int **)local_98.d;
      if ((QArrayData *)local_98.d != (QArrayData *)0x0) goto LAB_00109fc5;
    }
    LOCK();
    (((QBasicAtomicInt *)local_110._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_110._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i
         + 1;
    UNLOCK();
    local_f8._8_8_ = local_110._vptr_QPromiseBase;
  }
LAB_00109fda:
  local_e8 = (_Any_data *)&local_100;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_110._vptr_QPromiseBase = (_func_int **)local_f8._8_8_;
  local_f8._M_unused._M_object = local_a8.super_QPromiseBase<int>._vptr_QPromiseBase;
  local_78._M_unused._M_object = operator_new(0x18);
  *(void **)local_78._M_unused._0_8_ = local_f8._M_unused._M_object;
  if ((QArrayData *)local_f8._M_unused._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_f8._M_unused._0_8_ = *local_f8._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_f8._8_8_;
  if ((QArrayData *)local_f8._8_8_ == (QArrayData *)0x0) {
    *(_Any_data **)((long)local_78._M_unused._0_8_ + 0x10) = local_e8;
    pcStack_60 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + 1;
    UNLOCK();
    *(_Any_data **)((long)local_78._M_unused._0_8_ + 0x10) = local_e8;
    pcStack_60 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
    if ((QArrayData *)local_f8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_f8._8_8_ == 0) {
        operator_delete((void *)local_f8._8_8_,0x10);
      }
    }
  }
  if ((QArrayData *)local_f8._M_unused._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_f8._M_unused._0_8_ = *local_f8._M_unused._M_object + -1;
    UNLOCK();
    if (*local_f8._M_unused._M_object == 0) {
      operator_delete(local_f8._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  QVar4.d = local_128.m_d.d;
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_a8,
             (QPromiseResolve<void> *)&local_110,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if ((QArrayData *)local_110._vptr_QPromiseBase != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_110._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_110._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_110._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i
        == 0) {
      operator_delete(local_110._vptr_QPromiseBase,0x10);
    }
  }
  if ((QArrayData *)local_a8.super_QPromiseBase<int>._vptr_QPromiseBase != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_a8.super_QPromiseBase<int>._vptr_QPromiseBase)->_q_value).
    super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_a8.super_QPromiseBase<int>._vptr_QPromiseBase)->_q_value).
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_a8.super_QPromiseBase<int>._vptr_QPromiseBase)->_q_value).
        super___atomic_base<int>._M_i == 0) {
      operator_delete(local_a8.super_QPromiseBase<int>._vptr_QPromiseBase,0x10);
    }
  }
  if ((QArrayData *)local_98.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_98.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_98.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_98.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_98.d,0x10);
    }
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
  while (bVar5 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  pcVar10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
  ;
  cVar6 = QTest::qCompare((int)local_100.m_d.d,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                          ,0xaa);
  QVar4.d = local_128.m_d.d;
  if (cVar6 == '\0') {
    cVar6 = '\0';
  }
  else {
    bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
    bVar5 = (bool)(~bVar5 & ((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.
                            m_data._M_exception_object == (void *)0x0);
    local_f8._M_pod_data[0] = bVar5;
    local_d8._M_pod_data[0] = 1;
    pcVar7 = QTest::toString<bool>((bool *)local_f8._M_pod_data);
    pcVar8 = QTest::toString<bool>((bool *)local_d8._M_pod_data);
    pcVar10 = "p.isFulfilled()";
    cVar6 = QTest::compare_helper
                      (bVar5,"Compared values are not the same",pcVar7,pcVar8,"p.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                       ,0xab);
  }
  local_128._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001336e8;
  if (local_128.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_128.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1]
      )();
    }
  }
  if (cVar6 == '\0') {
    return;
  }
  QVar11.m_data = (storage_type *)0x3;
  QVar11.m_size = (qsizetype)&local_f8;
  QString::fromUtf8(QVar11);
  local_d8._M_unused._M_object = local_f8._M_unused._M_object;
  local_d8._8_8_ = local_f8._8_8_;
  local_c8 = (PromiseResolver<int> *)local_e8;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:173:24),_0>
            (&local_128,(QString *)&local_d8);
  local_128._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00133820;
  local_f8._8_8_ = &local_a8;
  local_a8.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  local_98.d = (Data *)0x0;
  callback_00.fulfilled._0_4_ = (int)local_f8._8_8_;
  callback_00.this = &local_128;
  callback_00.fulfilled._4_4_ = (int)((ulong)local_f8._8_8_ >> 0x20);
  callback_00.rejected = &local_98.d;
  local_f8._M_unused._M_object = &local_128;
  local_e8 = (_Any_data *)&local_98;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:58:22),_0>
            (&local_110,callback_00);
  local_110._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00133820;
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  local_128._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001336e8;
  if (local_128.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_128.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1]
      )();
    }
  }
  if ((QArrayData *)local_d8._M_unused._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_d8._M_unused._0_8_ = *local_d8._M_unused._M_object + -1;
    UNLOCK();
    if (*local_d8._M_unused._M_object == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._M_unused._0_8_,2,8);
    }
  }
  local_98.d = (Data *)0x0;
  psStack_90 = (storage_type_conflict *)0x0;
  local_88 = 0;
  this_01 = (PromiseData<int> *)operator_new(0x68);
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_01->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this_01->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_001338c0;
  QReadWriteLock::QReadWriteLock
            (&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_00133858;
  (this_01->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_01->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar1 = &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar9 = &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  LOCK();
  pQVar1 = &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_a8.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00133820;
  local_a8.super_QPromiseBase<int>.m_d.d = this_01;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&local_100,&local_a8);
  local_a8.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001336e8;
  if (local_a8.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_a8.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_a8.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_a8.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  QVar4.d = local_110.m_d.d;
  local_b0 = (QArrayData *)CONCAT44(local_100.m_d.d._4_4_,(int)local_100.m_d.d);
  if (local_b0 == (QArrayData *)0x0) {
    local_b0 = (QArrayData *)0x0;
  }
  else {
    LOCK();
    (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_80.d = (Data *)CONCAT44(local_100.m_d.d._4_4_,(int)local_100.m_d.d);
    if ((PromiseData<int> *)local_80.d != (PromiseData<int> *)0x0) {
      LOCK();
      *(int *)&(((PromiseData<int> *)local_80.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               _vptr_PromiseDataBase =
           *(int *)&(((PromiseData<int> *)local_80.d)->
                    super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase + 1;
      UNLOCK();
      goto LAB_0010a4d2;
    }
  }
  local_80.d = (Data *)0x0;
LAB_0010a4d2:
  QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_int_&)> *)&local_f8,
             (PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_b0,
             (QPromiseResolve<int> *)&local_80,(QPromiseReject<int> *)pcVar10);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_f8);
  if (local_e8 != (_Any_data *)0x0) {
    (*(code *)local_e8)(&local_f8,&local_f8,3);
  }
  QVar4.d = local_110.m_d.d;
  local_128._vptr_QPromiseBase = (_func_int **)local_b0;
  if (local_b0 != (QArrayData *)0x0) {
    LOCK();
    (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_128.m_d.d = (PromiseData<int> *)local_80.d;
  if ((PromiseData<int> *)local_80.d != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)&(local_80.d)->super_QSharedData)->
             _vptr_PromiseDataBase =
         *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)&(local_80.d)->super_QSharedData)->
                  _vptr_PromiseDataBase + 1;
    UNLOCK();
  }
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (PromiseResolver<int> *)0x0;
  pcStack_c0 = (code *)0x0;
  local_118 = &local_98;
  local_d8._M_unused._M_object = operator_new(0x18);
  *(_func_int ***)local_d8._M_unused._0_8_ = local_128._vptr_QPromiseBase;
  if ((QArrayData *)local_128._vptr_QPromiseBase != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_128._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_128._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i
         + 1;
    UNLOCK();
  }
  *(PromiseData<int> **)((long)local_d8._M_unused._0_8_ + 8) = local_128.m_d.d;
  if (local_128.m_d.d == (PromiseData<int> *)0x0) {
    *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> **)
     ((long)local_d8._M_unused._0_8_ + 0x10) = local_118;
    pcStack_c0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_c8 = (PromiseResolver<int> *)
               std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)&((local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
             _vptr_PromiseDataBase =
         *(int *)&((local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                  _vptr_PromiseDataBase + 1;
    UNLOCK();
    *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> **)
     ((long)local_d8._M_unused._0_8_ + 0x10) = local_118;
    pcStack_c0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_c8 = (PromiseResolver<int> *)
               std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
    if (local_128.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      *(int *)&((local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               _vptr_PromiseDataBase =
           *(int *)&((local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                    _vptr_PromiseDataBase + -1;
      UNLOCK();
      if (*(int *)&((local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                   _vptr_PromiseDataBase == 0) {
        operator_delete(local_128.m_d.d,0x10);
      }
    }
  }
  if ((QArrayData *)local_128._vptr_QPromiseBase != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_128._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_128._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_128._vptr_QPromiseBase)->_q_value).super___atomic_base<int>._M_i
        == 0) {
      operator_delete(local_128._vptr_QPromiseBase,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_d8);
  if (local_c8 != (PromiseResolver<int> *)0x0) {
    (*(code *)local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if ((PromiseData<int> *)local_80.d != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)&(local_80.d)->super_QSharedData)->
             _vptr_PromiseDataBase =
         *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)&(local_80.d)->super_QSharedData)->
                  _vptr_PromiseDataBase + -1;
    UNLOCK();
    if (*(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)&(local_80.d)->super_QSharedData)->
                 _vptr_PromiseDataBase == 0) {
      operator_delete(local_80.d,0x10);
    }
  }
  if (local_b0 != (QArrayData *)0x0) {
    LOCK();
    (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_b0,0x10);
    }
  }
  piVar2 = (int *)CONCAT44(local_100.m_d.d._4_4_,(int)local_100.m_d.d);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete((void *)CONCAT44(local_100.m_d.d._4_4_,(int)local_100.m_d.d),0x10);
    }
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(local_110.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(local_110.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    ((PromiseDataBase<int,_void_(const_int_&)> *)this_01);
  while (bVar5 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      ((PromiseDataBase<int,_void_(const_int_&)> *)this_01);
  }
  LOCK();
  (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_01);
  }
  QVar12.m_data = (storage_type *)0x3;
  QVar12.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar12);
  pp_Var3 = local_128._vptr_QPromiseBase;
  QVar13.m_data = psStack_90;
  QVar13.m_size = local_88;
  QVar14.m_data = (storage_type_conflict *)local_128.m_d.d;
  QVar14.m_size = (qsizetype)local_118;
  cVar6 = QTest::qCompare(QVar13,QVar14,"waitForError(p, QString{})","QString{\"foo\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                          ,0xb0);
  if ((QArrayData *)pp_Var3 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)pp_Var3)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)pp_Var3)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)pp_Var3)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)pp_Var3,2,8);
    }
  }
  if ((QArrayData *)local_98.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_98.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_98.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_98.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98.d,2,8);
    }
  }
  QVar4.d = local_110.m_d.d;
  if (cVar6 != '\0') {
    bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(local_110.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
    bVar5 = (bool)(~bVar5 & ((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.
                            m_data._M_exception_object != (void *)0x0);
    local_128._vptr_QPromiseBase = (_func_int **)CONCAT71(local_128._vptr_QPromiseBase._1_7_,bVar5);
    local_98.d._0_1_ = 1;
    pcVar10 = QTest::toString<bool>((bool *)&local_128);
    pcVar7 = QTest::toString<bool>((bool *)&local_98);
    QTest::compare_helper
              (bVar5,"Compared values are not the same",pcVar10,pcVar7,"p.isRejected()","true",
               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
               ,0xb1);
  }
  local_110._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001336e8;
  if (local_110.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_110.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_110.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_110.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1]
      )();
    }
  }
  return;
}

Assistant:

void tst_qpromise_then::nullHandler()
{
    { // resolved
        auto p = QtPromise::QPromise<int>::resolve(42).then(nullptr);

        QCOMPARE(waitForValue(p, -1), 42);
        QCOMPARE(p.isFulfilled(), true);
    }
    { // rejected
        auto p = QtPromise::QPromise<int>::reject(QString{"foo"}).then(nullptr);

        QCOMPARE(waitForError(p, QString{}), QString{"foo"});
        QCOMPARE(p.isRejected(), true);
    }
}